

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  float *__src;
  unsigned_short *__src_00;
  float *__dest;
  long lVar1;
  unsigned_short *__dest_00;
  int iVar2;
  
  if ((this->IndexLookup).Size < new_size) {
    iVar2 = (this->IndexAdvanceX).Capacity;
    if (iVar2 < new_size) {
      if (iVar2 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar2 / 2 + iVar2;
      }
      if (iVar2 <= new_size) {
        iVar2 = new_size;
      }
      __dest = (float *)ImGui::MemAlloc((long)iVar2 << 2);
      __src = (this->IndexAdvanceX).Data;
      if (__src != (float *)0x0) {
        memcpy(__dest,__src,(long)(this->IndexAdvanceX).Size << 2);
        ImGui::MemFree((this->IndexAdvanceX).Data);
      }
      (this->IndexAdvanceX).Data = __dest;
      (this->IndexAdvanceX).Capacity = iVar2;
    }
    iVar2 = (this->IndexAdvanceX).Size;
    lVar1 = (long)iVar2;
    if (iVar2 < new_size) {
      iVar2 = new_size - iVar2;
      do {
        (this->IndexAdvanceX).Data[lVar1] = -1.0;
        lVar1 = lVar1 + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    (this->IndexAdvanceX).Size = new_size;
    iVar2 = (this->IndexLookup).Capacity;
    if (iVar2 < new_size) {
      if (iVar2 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar2 / 2 + iVar2;
      }
      if (iVar2 <= new_size) {
        iVar2 = new_size;
      }
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar2 * 2);
      __src_00 = (this->IndexLookup).Data;
      if (__src_00 != (unsigned_short *)0x0) {
        memcpy(__dest_00,__src_00,(long)(this->IndexLookup).Size * 2);
        ImGui::MemFree((this->IndexLookup).Data);
      }
      (this->IndexLookup).Data = __dest_00;
      (this->IndexLookup).Capacity = iVar2;
    }
    iVar2 = (this->IndexLookup).Size;
    lVar1 = (long)iVar2;
    if (iVar2 < new_size) {
      iVar2 = new_size - iVar2;
      do {
        (this->IndexLookup).Data[lVar1] = 0xffff;
        lVar1 = lVar1 + 1;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    (this->IndexLookup).Size = new_size;
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexAdvanceX.Size == IndexLookup.Size);
    if (new_size <= IndexLookup.Size)
        return;
    IndexAdvanceX.resize(new_size, -1.0f);
    IndexLookup.resize(new_size, (ImWchar)-1);
}